

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::FileEntry::FileEntry(FileEntry *this,string *name)

{
  string *name_local;
  FileEntry *this_local;
  
  DirEntry::DirEntry(&this->super_DirEntry);
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__FileEntry_0019c2e0;
  nameinfo::nameinfo(&this->_name,name);
  (this->super_DirEntry)._magic = 0xfffff6fe;
  this->_datatable = 0;
  this->_sectionlist = 0;
  (this->super_DirEntry)._size = 0;
  this->_attr = 0x41;
  this->_filetime = 0;
  this->_reserved = 0;
  (this->super_DirEntry)._indexptr = 0;
  (this->super_DirEntry)._indexsize = 0;
  return;
}

Assistant:

explicit FileEntry(const std::string& name)
            : _name(name)
        {
            _magic= MAGIC;
            _datatable=0;
            _sectionlist=0;
            _size=0;
            _attr= 0x41;
            _filetime= 0;
            _reserved= 0;
            _indexptr=0;
            _indexsize=0;
        }